

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

Node * __thiscall
MarkerIndex::Iterator::insert_marker_start
          (Iterator *this,MarkerId *id,Point *start_position,Point *end_position)

{
  int iVar1;
  Point *end_position_local;
  Point *start_position_local;
  MarkerId *id_local;
  Iterator *this_local;
  
  reset(this);
  if (this->current_node == (Node *)0x0) {
    this_local = (Iterator *)operator_new(0x88);
    Node::Node((Node *)this_local,(Node *)0x0,*start_position);
    this->marker_index->root = (Node *)this_local;
  }
  else {
    while( true ) {
      while (iVar1 = Point::compare(start_position,&this->current_node_position), iVar1 != -1) {
        if (iVar1 == 0) {
          mark_right(this,id,start_position,end_position);
          return this->current_node;
        }
        if (iVar1 == 1) {
          if (this->current_node->right == (Node *)0x0) {
            insert_right_child(this,start_position);
            descend_right(this);
            mark_right(this,id,start_position,end_position);
            return this->current_node;
          }
          descend_right(this);
        }
      }
      mark_right(this,id,start_position,end_position);
      if (this->current_node->left == (Node *)0x0) break;
      descend_left(this);
    }
    insert_left_child(this,start_position);
    descend_left(this);
    mark_right(this,id,start_position,end_position);
    this_local = (Iterator *)this->current_node;
  }
  return (Node *)this_local;
}

Assistant:

MarkerIndex::Node *MarkerIndex::Iterator::insert_marker_start(const MarkerId &id, const Point &start_position, const Point &end_position) {
  reset();

  if (!current_node) {
    return marker_index->root = new Node(nullptr, start_position);
  }

  while (true) {
    switch (start_position.compare(current_node_position)) {
      case 0:
        mark_right(id, start_position, end_position);
        return current_node;
      case -1:
        mark_right(id, start_position, end_position);
        if (current_node->left) {
          descend_left();
          break;
        } else {
          insert_left_child(start_position);
          descend_left();
          mark_right(id, start_position, end_position);
          return current_node;
        }
      case 1:
        if (current_node->right) {
          descend_right();
          break;
        } else {
          insert_right_child(start_position);
          descend_right();
          mark_right(id, start_position, end_position);
          return current_node;
        }
    }
  }
}